

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O0

bool __thiscall version_struct::operator<(version_struct *this,char *v_str)

{
  bool bVar1;
  version_struct *in_RDI;
  version_struct v_tmp;
  char *in_stack_ffffffffffffffc8;
  version_struct *in_stack_ffffffffffffffd8;
  version_struct *in_stack_ffffffffffffffe0;
  
  version_struct(in_RDI,in_stack_ffffffffffffffc8);
  version_struct((version_struct *)&stack0xffffffffffffffd8,
                 (version_struct *)&stack0xffffffffffffffe4);
  bVar1 = operator<(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return bVar1;
}

Assistant:

bool operator<(const char* v_str)
  {
    version_struct v_tmp(v_str);
    return (*this < v_tmp);
  }